

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Freudenthal_triangulation.h
# Opt level: O0

Simplex_handle * __thiscall
Gudhi::coxeter_triangulation::
Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
          (Simplex_handle *__return_storage_ptr__,void *this,Matrix<double,__1,_1,_0,__1,_1> *point,
          double scale)

{
  uint uVar1;
  Index IVar2;
  invalid_argument *this_00;
  CoeffReturnType pdVar3;
  Vertex *pVVar4;
  Scalar *pSVar5;
  OrderedSetPartition *pOVar6;
  reference pvVar7;
  reference pvVar8;
  reference this_01;
  double dVar9;
  allocator<unsigned_long> local_199;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  ulong local_180;
  size_t i_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_170;
  vector<double,_std::allocator<double>_> *local_158;
  unsigned_long *local_150;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  unsigned_long *local_140;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_138;
  allocator<unsigned_long> local_129;
  undefined1 local_128 [8];
  Part indices;
  double local_108;
  int local_fc;
  double dStack_f8;
  int y_i_1;
  double x_i_1;
  size_t i_2;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_d0;
  undefined1 local_c0 [8];
  VectorXd x_vect;
  size_t i_1;
  VectorXd p_vect;
  int local_8c;
  double dStack_88;
  int y_i;
  double x_i;
  size_t i;
  vector<double,_std::allocator<double>_> z;
  double error;
  uint local_2c;
  double dStack_28;
  uint d;
  double scale_local;
  Matrix<double,__1,_1,_0,__1,_1> *point_local;
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  Simplex_handle *output;
  
  dStack_28 = scale;
  scale_local = (double)point;
  point_local = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  this_local = (Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)__return_storage_ptr__;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)point);
  local_2c = (uint)IVar2;
  if (local_2c != *this) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"The point must be of the same dimension as the triangulation");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(__return_storage_ptr__);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i);
  if ((*(byte *)((long)this + 0xd0) & 1) == 0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&i_1,&local_2c);
    for (x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
        (ulong)x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows < (ulong)local_2c;
        x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             + 1) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)scale_local,
                          x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
      dVar9 = *pdVar3;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&i_1,
                          x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
      *pSVar5 = dVar9;
    }
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&i_2,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&i_1,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)((long)this + 0x20));
    local_d0 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
               solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                           *)((long)this + 0x30),
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&i_2);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_c0,
               (EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_d0);
    for (x_i_1 = 0.0; dVar9 = dStack_28, (ulong)x_i_1 < (ulong)local_2c;
        x_i_1 = (double)((long)x_i_1 + 1)) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_c0,
                          (Index)x_i_1);
      dStack_f8 = dVar9 * *pSVar5;
      dVar9 = floor(dStack_f8);
      local_fc = (int)dVar9;
      pVVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::vertex(__return_storage_ptr__);
      std::vector<int,_std::allocator<int>_>::push_back(pVVar4,&local_fc);
      local_108 = dStack_f8 - (double)local_fc;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&i,&local_108);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i_1);
  }
  else {
    for (x_i = 0.0; dVar9 = dStack_28, (ulong)x_i < (ulong)local_2c; x_i = (double)((long)x_i + 1))
    {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)scale_local,
                          (Index)x_i);
      dStack_88 = dVar9 * *pdVar3;
      dVar9 = floor(dStack_88);
      local_8c = (int)dVar9;
      pVVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::vertex(__return_storage_ptr__);
      std::vector<int,_std::allocator<int>_>::push_back(pVVar4,&local_8c);
      p_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)(dStack_88 - (double)local_8c);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&i,
                 (value_type_conflict3 *)
                 &p_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
    }
  }
  indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)&i,
             (value_type_conflict3 *)
             &indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  uVar1 = local_2c + 1;
  std::allocator<unsigned_long>::allocator(&local_129);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,(ulong)uVar1,
             &local_129);
  std::allocator<unsigned_long>::~allocator(&local_129);
  local_138._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  local_140 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_138,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_140,0);
  local_148._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  local_150 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  local_158 = (vector<double,_std::allocator<double>_> *)&i;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Gudhi::coxeter_triangulation::Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>(Eigen::Matrix<double,_1,1,0,_1,1>const&,double)const::_lambda(unsigned_long,unsigned_long)_1_>
            (local_148,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_150,(anon_class_8_1_54a3981a)local_158);
  pOVar6 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition(__return_storage_ptr__);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,0);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_3 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_170,1,pvVar7,(allocator<unsigned_long> *)((long)&i_3 + 7));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::push_back(pOVar6,&local_170);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_170);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_3 + 7));
  for (local_180 = 1; local_180 <= local_2c; local_180 = local_180 + 1) {
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                        local_180 - 1);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,*pvVar7);
    dVar9 = *pvVar8;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,local_180
                       );
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,*pvVar7);
    if (dVar9 <= *pvVar8 + 1e-09) {
      pOVar6 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(__return_storage_ptr__);
      this_01 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::back(pOVar6);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                          local_180);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_01,pvVar7);
    }
    else {
      pOVar6 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(__return_storage_ptr__);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                          local_180);
      std::allocator<unsigned_long>::allocator(&local_199);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_198,1,pvVar7,&local_199);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(pOVar6,&local_198);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_198);
      std::allocator<unsigned_long>::~allocator(&local_199);
    }
  }
  z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  if ((z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~Permutahedral_representation(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Simplex_handle locate_point(const Point_d& point, double scale = 1) const {
    using Ordered_set_partition = typename Simplex_handle::OrderedSetPartition;
    using Part = typename Ordered_set_partition::value_type;
    unsigned d = point.size();
    GUDHI_CHECK(d == dimension_,
                std::invalid_argument("The point must be of the same dimension as the triangulation"));
    double error = 1e-9;
    Simplex_handle output;
    std::vector<double> z;
    if (is_freudenthal_) {
      for (std::size_t i = 0; i < d; i++) {
        double x_i = scale * point[i];
        int y_i = std::floor(x_i);
        output.vertex().push_back(y_i);
        z.push_back(x_i - y_i);
      }
    } else {
      Eigen::VectorXd p_vect(d);
      for (std::size_t i = 0; i < d; i++) p_vect(i) = point[i];
      Eigen::VectorXd x_vect = colpivhouseholderqr_.solve(p_vect - offset_);
      for (std::size_t i = 0; i < d; i++) {
        double x_i = scale * x_vect(i);
        int y_i = std::floor(x_i);
        output.vertex().push_back(y_i);
        z.push_back(x_i - y_i);
      }
    }
    z.push_back(0);
    Part indices(d + 1);
    std::iota(indices.begin(), indices.end(), 0);
    std::sort(indices.begin(), indices.end(), [&z](std::size_t i1, std::size_t i2) { return z[i1] > z[i2]; });

    output.partition().push_back(Part(1, indices[0]));
    for (std::size_t i = 1; i <= d; ++i)
      if (z[indices[i - 1]] > z[indices[i]] + error)
        output.partition().push_back(Part(1, indices[i]));
      else
        output.partition().back().push_back(indices[i]);
    return output;
  }